

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_htmlspecialchars(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  uint uVar2;
  undefined8 in_RAX;
  byte *zString;
  int iVar3;
  uint uVar4;
  char *zString_00;
  byte *pbVar5;
  byte *pbVar6;
  int nLen;
  
  nLen = (int)((ulong)in_RAX >> 0x20);
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9_result_null(pCtx);
  }
  else {
    zString = (byte *)jx9_value_to_string(*apArg,&nLen);
    if (nArg == 1) {
      uVar4 = 0;
    }
    else {
      uVar2 = jx9_value_to_int(apArg[1]);
      uVar4 = 0;
      if (-1 < (int)uVar2) {
        uVar4 = uVar2;
      }
    }
    pbVar6 = zString + nLen;
    while (zString < pbVar6) {
      iVar3 = 0;
      pbVar5 = zString;
      while ((pbVar5 < pbVar6 &&
             ((0x3e < (ulong)*pbVar5 || ((0x500000c400000000U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
             ))) {
        pbVar5 = pbVar5 + 1;
        iVar3 = iVar3 + 1;
      }
      if (zString < pbVar5) {
        jx9_result_string(pCtx,(char *)zString,iVar3);
      }
      if (pbVar6 <= pbVar5) {
        return 0;
      }
      bVar1 = *pbVar5;
      if (bVar1 == 0x22) {
        if ((uVar4 & 4) == 0) {
          zString_00 = "&quot;";
LAB_0012a906:
          iVar3 = 6;
        }
        else {
          zString_00 = "\"";
LAB_0012a911:
          iVar3 = 1;
        }
LAB_0012a913:
        jx9_result_string(pCtx,zString_00,iVar3);
      }
      else {
        if (bVar1 == 0x3e) {
          zString_00 = "&gt;";
LAB_0012a8d7:
          iVar3 = 4;
          goto LAB_0012a913;
        }
        if (bVar1 == 0x27) {
          if ((uVar4 & 2) != 0) {
            zString_00 = "&#039;";
            goto LAB_0012a906;
          }
          zString_00 = "\'";
          goto LAB_0012a911;
        }
        if (bVar1 == 0x3c) {
          zString_00 = "&lt;";
          goto LAB_0012a8d7;
        }
        if (bVar1 == 0x26) {
          zString_00 = "&amp;";
          iVar3 = 5;
          goto LAB_0012a913;
        }
      }
      zString = pbVar5 + 1;
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_htmlspecialchars(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zCur, *zIn, *zEnd;
	int iFlags = 0x01|0x40; /* ENT_COMPAT | ENT_HTML401 */
	int nLen, c;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	/* Extract the flags if available */
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
		if( iFlags < 0 ){
			iFlags = 0x01|0x40;
		}
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			break;
		}
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '&' && zIn[0] != '\'' && zIn[0] != '"' && zIn[0] != '<' && zIn[0] != '>' ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Append the raw string verbatim */
			jx9_result_string(pCtx, zCur, (int)(zIn-zCur));
		}
		if( zIn >= zEnd ){
			break;
		}
		c = zIn[0];
		if( c == '&' ){
			/* Expand '&amp;' */
			jx9_result_string(pCtx, "&amp;", (int)sizeof("&amp;")-1);
		}else if( c == '<' ){
			/* Expand '&lt;' */
			jx9_result_string(pCtx, "&lt;", (int)sizeof("&lt;")-1);
		}else if( c == '>' ){
			/* Expand '&gt;' */
			jx9_result_string(pCtx, "&gt;", (int)sizeof("&gt;")-1);
		}else if( c == '\'' ){
			if( iFlags & 0x02 /*ENT_QUOTES*/ ){
				/* Expand '&#039;' */
				jx9_result_string(pCtx, "&#039;", (int)sizeof("&#039;")-1);
			}else{
				/* Leave the single quote untouched */
				jx9_result_string(pCtx, "'", (int)sizeof(char));
			}
		}else if( c == '"' ){
			if( (iFlags & 0x04) == 0 /*ENT_NOQUOTES*/ ){
				/* Expand '&quot;' */
				jx9_result_string(pCtx, "&quot;", (int)sizeof("&quot;")-1);
			}else{
				/* Leave the double quote untouched */
				jx9_result_string(pCtx, "\"", (int)sizeof(char));
			}
		}
		/* Ignore the unsafe HTML character */
		zIn++;
	}
	return JX9_OK;
}